

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

void __thiscall ChronoTest_Locale_Test::TestBody(ChronoTest_Locale_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_5;
  locale loc_6;
  AssertionResult gtest_ar_4;
  locale loc_5;
  seconds sec;
  tm time;
  AssertionResult gtest_ar_3;
  locale loc_4;
  AssertionResult gtest_ar_2;
  locale loc_3;
  AssertionResult gtest_ar_1;
  locale loc_2;
  AssertionResult gtest_ar;
  locale loc_1;
  runtime_error *anon_var_0;
  locale loc;
  bool has_locale;
  char *loc_name;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  char *in_stack_fffffffffffffb88;
  int line;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  undefined8 in_stack_fffffffffffffb98;
  Type TVar6;
  AssertHelper *in_stack_fffffffffffffba0;
  duration<long,_std::ratio<3600L,_1L>_> *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  locale *in_stack_fffffffffffffbc8;
  locale *loc_00;
  Message *in_stack_fffffffffffffbe8;
  AssertHelper *in_stack_fffffffffffffbf0;
  string local_408 [32];
  string local_3e8 [32];
  AssertionResult local_3c8;
  locale local_3b8 [24];
  string local_3a0 [32];
  string local_380 [32];
  AssertionResult local_360;
  locale local_350 [8];
  undefined8 local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  int local_2f4;
  duration<long,std::ratio<1l,1l>> local_2f0 [8];
  string local_2e8 [32];
  undefined1 local_2c8 [48];
  locale *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  tm *in_stack_fffffffffffffd78;
  AssertionResult local_270;
  locale local_260 [28];
  int local_244;
  duration<long,std::ratio<60l,1l>> local_240 [8];
  string local_238 [88];
  string local_1e0 [32];
  AssertionResult local_1c0;
  locale local_1b0 [28];
  int local_194;
  duration<long,std::ratio<3600l,1l>> local_190 [8];
  string local_188 [32];
  locale local_168 [56];
  string local_130 [32];
  AssertionResult local_110;
  locale local_100 [28];
  int local_e4;
  duration<long,std::ratio<3600l,1l>> local_e0 [8];
  string local_d8 [88];
  string local_80 [32];
  AssertionResult local_60;
  locale local_50 [12];
  undefined4 local_44;
  locale local_28 [8];
  locale local_20 [15];
  undefined1 local_11;
  char *local_10;
  
  TVar6 = (Type)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  local_10 = "ja_JP.utf8";
  local_11 = 0;
  std::locale::locale(local_20);
  std::locale::locale(local_28,local_10);
  std::locale::operator=(local_20,local_28);
  std::locale::~locale(local_28);
  local_11 = 1;
  std::locale::locale(local_50,"ja_JP.utf8");
  make_hour(in_stack_fffffffffffffb74);
  format_tm_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_e4 = 0xe;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_e0,&local_e4);
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<3600l,1l>>>
            (in_stack_fffffffffffffbc8,
             (char (*) [7])CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb88,
             (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x116580);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffba0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x1165dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116635);
  std::locale::~locale(local_50);
  std::locale::locale(local_100,"ja_JP.utf8");
  loc_00 = local_168;
  make_hour(in_stack_fffffffffffffb74);
  format_tm_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_194 = 0xe;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_190,&local_194);
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<3600l,1l>>>
            (loc_00,(char (*) [7])CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb88,
             (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_130);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffbb8 =
         (duration<long,_std::ratio<3600L,_1L>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1167fc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffba0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x116859);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1168b1);
  std::locale::~locale(local_100);
  std::locale::locale(local_1b0,"ja_JP.utf8");
  make_minute(in_stack_fffffffffffffb74);
  format_tm_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_244 = 0x2a;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_240,&local_244);
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<60l,1l>>>
            (loc_00,(char (*) [7])CONCAT17(uVar2,in_stack_fffffffffffffbc0),
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb88,
             (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffba0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x116a78);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffba0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x116ad5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116b2d);
  std::locale::~locale(local_1b0);
  std::locale::locale(local_260,"ja_JP.utf8");
  TVar6 = (Type)((ulong)local_2c8 >> 0x20);
  make_second(in_stack_fffffffffffffb74);
  format_tm_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_2f4 = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_2f0,&local_2f4);
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
            (loc_00,(char (*) [7])CONCAT17(uVar2,in_stack_fffffffffffffbc0),
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb88,
             (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffb88 =
         testing::AssertionResult::failure_message((AssertionResult *)0x116cf4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffba0,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb90),
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x116d51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116da9);
  std::locale::~locale(local_260);
  make_tm();
  local_338 = 3;
  local_33c = 0x19;
  local_340 = 0x2d;
  local_348 = 0x3039;
  std::locale::locale(local_350,"ja_JP.utf8");
  format_tm_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            (loc_00,(char (*) [6])CONCAT17(uVar2,in_stack_fffffffffffffbc0),
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb88,
             (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_380);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffb78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x116f74);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffba0,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb90),
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x116fd1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x117029);
  std::locale::~locale(local_350);
  std::locale::locale(local_3b8,"ja_JP.utf8");
  format_tm_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            (loc_00,(char (*) [6])CONCAT17(uVar2,in_stack_fffffffffffffbc0),
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb88,(char *)CONCAT17(uVar4,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  line = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb74);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1171ba);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffba0,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb90),
               line,(char *)CONCAT17(uVar4,in_stack_fffffffffffffb80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar5,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x117215);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11726a);
  std::locale::~locale(local_3b8);
  local_44 = 0;
  std::locale::~locale(local_20);
  return;
}

Assistant:

TEST(ChronoTest, Locale) {
  const char *loc_name = "ja_JP.utf8";
  bool has_locale = false;
  std::locale loc;
  try {
    loc = std::locale(loc_name);
    has_locale = true;
  } catch (const std::runtime_error &) {}
  if (!has_locale) {
    fmt::print("{} locale is missing.\n", loc_name);
    return;
  }
  EXPECT_TIME("%OH", make_hour(14), std::chrono::hours(14));
  EXPECT_TIME("%OI", make_hour(14), std::chrono::hours(14));
  EXPECT_TIME("%OM", make_minute(42), std::chrono::minutes(42));
  EXPECT_TIME("%OS", make_second(42), std::chrono::seconds(42));
  auto time = make_tm();
  time.tm_hour = 3;
  time.tm_min = 25;
  time.tm_sec = 45;
  auto sec = std::chrono::seconds(12345);
  EXPECT_TIME("%r", time, sec);
  EXPECT_TIME("%p", time, sec);
}